

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O1

void I_PrintStr(char *cp)

{
  byte bVar1;
  size_t sVar2;
  byte *__s;
  byte *pbVar3;
  
  sVar2 = strlen(cp);
  __s = (byte *)operator_new__(sVar2 + 1);
  pbVar3 = __s;
  while( true ) {
    cp = cp + 1;
    while (bVar1 = cp[-1], bVar1 - 0x1c < 4) {
      if (*cp == '\0') goto LAB_002cacaf;
      cp = cp + 2;
    }
    if (bVar1 == 0) break;
    *pbVar3 = bVar1;
    pbVar3 = pbVar3 + 1;
  }
LAB_002cacaf:
  *pbVar3 = 0;
  fputs((char *)__s,_stdout);
  operator_delete__(__s);
  fflush(_stdout);
  return;
}

Assistant:

void I_PrintStr (const char *cp)
{
	// Strip out any color escape sequences before writing to the log file
	char * copy = new char[strlen(cp)+1];
	const char * srcp = cp;
	char * dstp = copy;

	while (*srcp != 0)
	{
		if (*srcp!=0x1c && *srcp!=0x1d && *srcp!=0x1e && *srcp!=0x1f)
		{
			*dstp++=*srcp++;
		}
		else
		{
			if (srcp[1]!=0) srcp+=2;
			else break;
		}
	}
	*dstp=0;

	fputs (copy, stdout);
	delete [] copy;
	fflush (stdout);
}